

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

Col_Word Col_Subrope(Col_Word rope,size_t first,size_t last)

{
  Col_StringFormat format_00;
  int iVar1;
  size_t sVar2;
  size_t max;
  Col_Word CVar3;
  Cell *pacVar4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  Col_StringFormat local_d8;
  undefined1 auStack_d4 [4];
  MergeRopeChunksInfo info;
  Col_CustomRopeType *typeInfo;
  size_t leftLength;
  Col_StringFormat format;
  size_t length;
  uchar depth;
  size_t ropeLength;
  Col_Word subrope;
  size_t last_local;
  size_t first_local;
  Col_Word rope_local;
  
  length._7_1_ = '\0';
  if (rope == 0) {
    local_dc = 0;
  }
  else {
    if ((rope & 0xf) == 0) {
      if ((*(byte *)rope & 2) == 0) {
        local_e4 = 0xffffffff;
      }
      else {
        local_e4 = *(byte *)rope & 0xfffffffe;
      }
      local_e0 = local_e4;
    }
    else {
      local_e0 = immediateWordTypes[rope & 0x1f];
    }
    local_dc = local_e0;
  }
  first_local = rope;
  if ((local_dc == 2) && ((*(ushort *)(rope + 2) & 0xc) == 0)) {
    first_local = *(size_t *)(rope + 0x10);
  }
  if (last < first) {
    return 0xc;
  }
  sVar2 = Col_RopeLength(first_local);
  if (sVar2 <= first) {
    return 0xc;
  }
  subrope = last;
  if (sVar2 <= last) {
    subrope = sVar2 - 1;
  }
  max = (subrope - first) + 1;
  if ((first == 0) && (max == sVar2)) {
    return first_local;
  }
  if (first_local == 0) {
    local_e8 = 0;
  }
  else {
    if ((first_local & 0xf) == 0) {
      if ((*(byte *)first_local & 2) == 0) {
        local_f0 = 0xffffffff;
      }
      else {
        local_f0 = *(byte *)first_local & 0xfffffffe;
      }
      local_ec = local_f0;
    }
    else {
      local_ec = immediateWordTypes[first_local & 0x1f];
    }
    local_e8 = local_ec;
  }
  switch(local_e8) {
  case 6:
    format_00 = (Col_StringFormat)*(char *)(first_local + 1);
    if (max * (format_00 & (COL_UCS4|COL_UCS2|COL_UCS1)) < 0x5d) {
      CVar3 = Col_NewRope(format_00,
                          (void *)(first_local + 4 +
                                  first * (format_00 & (COL_UCS4|COL_UCS2|COL_UCS1))),
                          max * (format_00 & (COL_UCS4|COL_UCS2|COL_UCS1)));
      return CVar3;
    }
    break;
  case 0xe:
    CVar3 = Col_Subrope(*(Col_Word *)(first_local + 8),*(long *)(first_local + 0x10) + first,
                        *(long *)(first_local + 0x10) + subrope);
    return CVar3;
  case 0x12:
    typeInfo = (Col_CustomRopeType *)(ulong)*(ushort *)(first_local + 2);
    if (typeInfo == (Col_CustomRopeType *)0x0) {
      typeInfo = (Col_CustomRopeType *)Col_RopeLength(*(Col_Word *)(first_local + 0x10));
    }
    if (subrope < typeInfo) {
      CVar3 = Col_Subrope(*(Col_Word *)(first_local + 0x10),first,subrope);
      return CVar3;
    }
    if (typeInfo <= first) {
      CVar3 = Col_Subrope(*(Col_Word *)(first_local + 0x18),first - (long)typeInfo,
                          subrope - (long)typeInfo);
      return CVar3;
    }
    length._7_1_ = *(char *)(first_local + 1);
    break;
  case 0xfffffffb:
    CVar3 = Col_NewRope(COL_UCS1,(void *)((long)&first_local + first + 1),max);
    return CVar3;
  case 0xfffffffc:
    return first_local;
  case 0xffffffff:
    info.byteLength = *(ulong *)first_local & 0xfffffffffffffffe;
    if ((*(long *)(info.byteLength + 0x40) != 0) &&
       (CVar3 = (**(code **)(info.byteLength + 0x40))(first_local,first,subrope), CVar3 != 0)) {
      return CVar3;
    }
  }
  if (max < 0x61) {
    info.data[0x5c] = '\0';
    info.data[0x5d] = '\0';
    info.data[0x5e] = '\0';
    info.data[0x5f] = '\0';
    info._100_4_ = 0;
    info.length = 0;
    iVar1 = Col_TraverseRopeChunks
                      (first_local,first,max,0,MergeRopeChunksProc,&local_d8,(size_t *)0x0);
    if (iVar1 == 0) {
      CVar3 = Col_NewRope(local_d8,auStack_d4,info.length);
      return CVar3;
    }
  }
  pacVar4 = AllocCells(1);
  (*pacVar4)[0] = '\x0e';
  (*pacVar4)[1] = length._7_1_;
  *(size_t *)(*pacVar4 + 8) = first_local;
  *(size_t *)(*pacVar4 + 0x10) = first;
  *(Col_Word *)(*pacVar4 + 0x18) = subrope;
  return (Col_Word)pacVar4;
}

Assistant:

Col_Word
Col_Subrope(
    Col_Word rope,              /*!< The rope to extract the subrope from. */
    size_t first,               /*!< Index of first character in subrope. */
    size_t last)                /*!< Index of last character in subrope. */
{
    Col_Word subrope;           /* Resulting rope in the general case. */
    size_t ropeLength;          /* Length of source rope. */
    unsigned char depth=0;      /* Depth of source rope. */
    size_t length;              /* Length of resulting subrope. */

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPE,rope} */
    TYPECHECK_ROPE(rope) return WORD_NIL;

    WORD_UNWRAP(rope);

    /*
     * Quick cases.
     */

    if (last < first) {
        /*
         * Invalid range.
         */

        return WORD_SMALLSTR_EMPTY;
    }

    ropeLength = Col_RopeLength(rope);
    if (first >= ropeLength) {
        /*
         * Beginning is past the end of the string.
         */

        return WORD_SMALLSTR_EMPTY;
    }

    if (last >= ropeLength) {
        /*
         * Truncate overlong subropes. (Note: at this point ropeLength > 1)
         */

        last = ropeLength-1;
    }

    length = last-first+1;

    if (first == 0 && length == ropeLength) {
        /*
         * Identity.
         */

        return rope;
    }

    /*
     * Type-specific quick cases.
     */

    switch (WORD_TYPE(rope)) {
    /*
     * Immediate types.
     */

    case WORD_TYPE_CHARBOOL:
        /*
         * Identity, already done.
         */

        ASSERT(WORD_CHAR_WIDTH(rope));
        ASSERT(0);
        return rope;

    case WORD_TYPE_SMALLSTR:
        return Col_NewRope(COL_UCS1, WORD_SMALLSTR_DATA(rope)+first, length);

    /*
     * Handle fixed width leaf ropes directly; this will be faster than the
     * generic case below.
     */

    case WORD_TYPE_UCSSTR: {
        Col_StringFormat format = (Col_StringFormat) WORD_UCSSTR_FORMAT(rope);
        if (length * CHAR_WIDTH(format) <= MAX_SHORT_LEAF_SIZE
                - UCSSTR_HEADER_SIZE) {
            return Col_NewRope(format, WORD_UCSSTR_DATA(rope)
                    + first * CHAR_WIDTH(format),
                    length * CHAR_WIDTH(format));
        }
        break;
        }

    case WORD_TYPE_SUBROPE:
        /*
         * Point to original source.
         */

        return Col_Subrope(WORD_SUBROPE_SOURCE(rope),
                WORD_SUBROPE_FIRST(rope)+first,
                WORD_SUBROPE_FIRST(rope)+last);

    case WORD_TYPE_CONCATROPE: {
        /*
         * Try to find the deepest superset of the subrope.
         */

        size_t leftLength = WORD_CONCATROPE_LEFT_LENGTH(rope);
        if (leftLength == 0) {
            leftLength = Col_RopeLength(WORD_CONCATROPE_LEFT(rope));
        }
        if (last < leftLength) {
            /*
             * Left arm is a superset of subrope.
             */

            return Col_Subrope(WORD_CONCATROPE_LEFT(rope), first, last);
        } else if (first >= leftLength) {
            /*
             * Right arm is a superset of subrope.
             */

            return Col_Subrope(WORD_CONCATROPE_RIGHT(rope), first-leftLength,
                    last-leftLength);
        }
        depth = WORD_CONCATROPE_DEPTH(rope);
        break;
        }

    case WORD_TYPE_CUSTOM: {
        Col_CustomRopeType *typeInfo
                = (Col_CustomRopeType *) WORD_TYPEINFO(rope);
        ASSERT(typeInfo->type.type == COL_ROPE);
        if (typeInfo->subropeProc) {
            if ((subrope = typeInfo->subropeProc(rope, first, last))
                    != WORD_NIL) {
                return subrope;
            }
        }
        break;
        }

        /* WORD_TYPE_UNKNOWN */
    }

    /*
     * Try to build a short subrope if possible.
     *
     * Make the test on char length, the traversal will check for byte length.
     */

    if (length <= MAX_SHORT_LEAF_SIZE) {
        MergeRopeChunksInfo info;
        info.length = 0;
        info.byteLength = 0;

        if (Col_TraverseRopeChunks(rope, first, length, 0, MergeRopeChunksProc,
                &info, NULL) == 0) {
            /*
             * Zero result means data fits into one short leaf.
             */

            return Col_NewRope(info.format, info.data, info.byteLength);
        }
    }

    /*
     * General case: build a subrope node.
     */

    subrope = (Col_Word) AllocCells(1);
    WORD_SUBROPE_INIT(subrope, depth, rope, first, last);

    return subrope;
}